

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O3

CrcCordState * __thiscall
absl::lts_20250127::crc_internal::CrcCordState::operator=(CrcCordState *this,CrcCordState *other)

{
  RefcountedRep *pRVar1;
  
  if (this != other) {
    Unref(this->refcounted_rep_);
    this->refcounted_rep_ = other->refcounted_rep_;
    pRVar1 = RefSharedEmptyRep();
    other->refcounted_rep_ = pRVar1;
  }
  return this;
}

Assistant:

CrcCordState& CrcCordState::operator=(CrcCordState&& other) {
  if (this != &other) {
    Unref(refcounted_rep_);
    refcounted_rep_ = other.refcounted_rep_;
    // Make `other` valid for use after move.
    other.refcounted_rep_ = RefSharedEmptyRep();
  }
  return *this;
}